

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_Plugin_SourceFeatures_Test::
TestBody(CommandLineInterfaceTest_Plugin_SourceFeatures_Test *this)

{
  string_view contents;
  bool bVar1;
  Descriptor *pDVar2;
  FileDescriptor *pFVar3;
  char *pcVar4;
  FileDescriptorProto *pFVar5;
  string *psVar6;
  DescriptorProto *pDVar7;
  FieldDescriptorProto *pFVar8;
  FieldOptions *pFVar9;
  char *in_R9;
  string_view src;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffba0;
  AssertHelper local_390;
  Message local_388;
  protobuf local_380 [8];
  char local_378 [8];
  undefined1 local_370 [8];
  AssertionResult gtest_ar_3;
  FeatureSet *features_1;
  Message local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_2;
  Message local_330;
  protobuf local_328 [8];
  char local_320 [8];
  undefined1 local_318 [8];
  AssertionResult gtest_ar_1;
  FeatureSet *features;
  Message local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2c0;
  Message local_2b8;
  string_view local_2b0;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__1;
  CodeGeneratorRequest request;
  string local_210;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined1 local_1e0 [16];
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_;
  string binary_request;
  undefined1 local_188 [8];
  string base64_output;
  AlphaNum local_138;
  string local_108;
  allocator<char> local_e1;
  undefined1 local_e0 [8];
  string plugin_path;
  char *local_b8;
  string_view local_b0;
  string local_a0;
  string_view local_80;
  string_view local_70 [2];
  string local_50;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_Plugin_SourceFeatures_Test *local_10;
  CommandLineInterfaceTest_Plugin_SourceFeatures_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"google/protobuf/descriptor.proto");
  pDVar2 = DescriptorProto::descriptor();
  pFVar3 = Descriptor::file(pDVar2);
  FileDescriptor::DebugString_abi_cxx11_(&local_50,pFVar3);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_70,"google/protobuf/unittest_features.proto");
  pDVar2 = pb::TestFeatures::descriptor();
  pFVar3 = Descriptor::file(pDVar2);
  FileDescriptor::DebugString_abi_cxx11_(&local_a0,pFVar3);
  local_80 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a0);
  CommandLineInterfaceTester::CreateTempFile
            ((CommandLineInterfaceTester *)this,local_70[0],local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&plugin_path.field_2 + 8),
             "\n    edition = \"2023\";\n    import \"google/protobuf/unittest_features.proto\";\n    package foo;\n    message Foo {\n      int32 b = 1 [\n        features.(pb.test).field_feature = VALUE6,\n        features.(pb.test).source_feature = VALUE5\n      ];\n    }\n  "
            );
  contents._M_str = local_b8;
  contents._M_len = plugin_path.field_2._8_8_;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_b0,contents);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/fake_plugin"
             ,&local_e1);
  std::allocator<char>::~allocator(&local_e1);
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_138,
             "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir foo.proto --plugin=prefix-gen-fake_plugin="
            );
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            ((AlphaNum *)((long)&base64_output.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_108,(lts_20250127 *)&local_138,(AlphaNum *)((long)&base64_output.field_2 + 8),
             (AlphaNum *)plugin_path.field_2._8_8_);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&binary_request.field_2 + 8)
             ,"foo.proto.request");
  compiler::(anonymous_namespace)::CommandLineInterfaceTest::ReadFile_abi_cxx11_
            ((string *)local_188,this,stack0xfffffffffffffe68);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  local_1e0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_188);
  src._M_str = (char *)&gtest_ar_.message_;
  src._M_len = local_1e0._8_8_;
  local_1c9 = absl::lts_20250127::Base64Unescape
                        (local_1e0._0_8_,src,(Nonnull<std::string_*>)local_1e0._0_8_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_210,(internal *)local_1c8,
               (AssertionResult *)"absl::Base64Unescape(base64_output, &binary_request)","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x70e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  if (bVar1) {
    CodeGeneratorRequest::CodeGeneratorRequest((CodeGeneratorRequest *)&gtest_ar__1.message_);
    local_2b0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&gtest_ar_.message_);
    local_299 = protobuf::MessageLite::ParseFromString
                          ((MessageLite *)&gtest_ar__1.message_,local_2b0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_298,&local_299,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
    if (!bVar1) {
      testing::Message::Message(&local_2b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_298,
                 (AssertionResult *)"request.ParseFromString(binary_request)","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x710,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
      testing::internal::AssertHelper::~AssertHelper(&local_2c0);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_2b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
    if (bVar1) {
      pFVar5 = CodeGeneratorRequest::proto_file((CodeGeneratorRequest *)&gtest_ar__1.message_,2);
      psVar6 = FileDescriptorProto::name_abi_cxx11_(pFVar5);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
                ((EqHelper *)local_2f0,"request.proto_file(2).name()","\"foo.proto\"",psVar6,
                 (char (*) [10])0x1e1d402);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
      if (!bVar1) {
        testing::Message::Message(&local_2f8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&features,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x713,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&features,&local_2f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&features);
        testing::Message::~Message(&local_2f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
      if (bVar1) {
        pFVar5 = CodeGeneratorRequest::proto_file((CodeGeneratorRequest *)&gtest_ar__1.message_,2);
        pDVar7 = FileDescriptorProto::message_type(pFVar5,0);
        pFVar8 = DescriptorProto::field(pDVar7,0);
        pFVar9 = FieldDescriptorProto::options(pFVar8);
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )FieldOptions::features(pFVar9);
        EqualsProto<char_const*>(local_328,"[pb.test] { field_feature: VALUE6 }");
        testing::internal::
        MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
                  ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffffba0._M_head_impl);
        testing::internal::
        PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::
        operator()(local_318,local_320,(FeatureSet *)0x20488b3);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
        if (!bVar1) {
          testing::Message::Message(&local_330);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                     ,0x717,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_2.message_,&local_330);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_330);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
        pFVar5 = CodeGeneratorRequest::source_file_descriptors
                           ((CodeGeneratorRequest *)&gtest_ar__1.message_,0);
        psVar6 = FileDescriptorProto::name_abi_cxx11_(pFVar5);
        testing::internal::EqHelper::
        Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
                  ((EqHelper *)local_348,"request.source_file_descriptors(0).name()","\"foo.proto\""
                   ,psVar6,(char (*) [10])0x1e1d402);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
        if (!bVar1) {
          testing::Message::Message(&local_350);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&features_1,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                     ,0x71b,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&features_1,&local_350);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&features_1);
          testing::Message::~Message(&local_350);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
        if (bVar1) {
          pFVar5 = CodeGeneratorRequest::source_file_descriptors
                             ((CodeGeneratorRequest *)&gtest_ar__1.message_,0);
          pDVar7 = FileDescriptorProto::message_type(pFVar5,0);
          pFVar8 = DescriptorProto::field(pDVar7,0);
          pFVar9 = FieldDescriptorProto::options(pFVar8);
          gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )FieldOptions::features(pFVar9);
          EqualsProto<char_const*>
                    (local_380,
                     "[pb.test] {\n                                             field_feature: VALUE6\n                                             source_feature: VALUE5\n                                           }"
                    );
          testing::internal::
          MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
                    ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffffba0._M_head_impl);
          testing::internal::
          PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::
          operator()(local_370,local_378,(FeatureSet *)0x20488b3);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
          if (!bVar1) {
            testing::Message::Message(&local_388);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
            testing::internal::AssertHelper::AssertHelper
                      (&local_390,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                       ,0x724,pcVar4);
            testing::internal::AssertHelper::operator=(&local_390,&local_388);
            testing::internal::AssertHelper::~AssertHelper(&local_390);
            testing::Message::~Message(&local_388);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
        }
      }
    }
    CodeGeneratorRequest::~CodeGeneratorRequest((CodeGeneratorRequest *)&gtest_ar__1.message_);
  }
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)local_e0);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_SourceFeatures) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("google/protobuf/unittest_features.proto",
                 pb::TestFeatures::descriptor()->file()->DebugString());
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "google/protobuf/unittest_features.proto";
    package foo;
    message Foo {
      int32 b = 1 [
        features.(pb.test).field_feature = VALUE6,
        features.(pb.test).source_feature = VALUE5
      ];
    }
  )schema");

#ifdef GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH
  std::string plugin_path = GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH;
#else
  std::string plugin_path = absl::StrCat(
      TestUtil::TestSourceDir(), "/google/protobuf/compiler/fake_plugin");
#endif

  // Invoke protoc with fake_plugin to get ahold of the CodeGeneratorRequest
  // sent by protoc.
  Run(absl::StrCat(
      "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir "
      "foo.proto --plugin=prefix-gen-fake_plugin=",
      plugin_path));
  ExpectNoErrors();
  std::string base64_output = ReadFile("foo.proto.request");
  std::string binary_request;
  ASSERT_TRUE(absl::Base64Unescape(base64_output, &binary_request));
  CodeGeneratorRequest request;
  ASSERT_TRUE(request.ParseFromString(binary_request));

  {
    ASSERT_EQ(request.proto_file(2).name(), "foo.proto");
    const FeatureSet& features =
        request.proto_file(2).message_type(0).field(0).options().features();
    EXPECT_THAT(features,
                EqualsProto(R"pb([pb.test] { field_feature: VALUE6 })pb"));
  }

  {
    ASSERT_EQ(request.source_file_descriptors(0).name(), "foo.proto");
    const FeatureSet& features = request.source_file_descriptors(0)
                                     .message_type(0)
                                     .field(0)
                                     .options()
                                     .features();
    EXPECT_THAT(features, EqualsProto(R"pb([pb.test] {
                                             field_feature: VALUE6
                                             source_feature: VALUE5
                                           })pb"));
  }
}